

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsettings.cpp
# Opt level: O2

void __thiscall icu_63::CollationSettings::resetReordering(CollationSettings *this)

{
  this->reorderTable = (uint8_t *)0x0;
  this->minHighNoReorder = 0;
  this->reorderRangesLength = 0;
  this->reorderCodesLength = 0;
  return;
}

Assistant:

void
CollationSettings::resetReordering() {
    // When we turn off reordering, we want to set a NULL permutation
    // rather than a no-op permutation.
    // Keep the memory via reorderCodes and its capacity.
    reorderTable = NULL;
    minHighNoReorder = 0;
    reorderRangesLength = 0;
    reorderCodesLength = 0;
}